

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::DefaultPrintTo<std::vector<double,std::allocator<double>>>
               (undefined8 param_1,vector<double,_std::allocator<double>_> *param_2,ostream *param_3
               )

{
  bool bVar1;
  reference value;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_38;
  const_iterator it;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  vector<double,_std::allocator<double>_> *container_local;
  IsContainer param_0_local;
  
  std::operator<<(param_3,'{');
  it._M_current = (double *)0x0;
  local_38._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(param_2);
  do {
    local_40._M_current = (double *)std::vector<double,_std::allocator<double>_>::end(param_2);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) {
LAB_0015b8db:
      if (it._M_current != (double *)0x0) {
        std::operator<<(param_3,' ');
      }
      std::operator<<(param_3,'}');
      return;
    }
    if ((it._M_current != (double *)0x0) &&
       (std::operator<<(param_3,','), it._M_current == (double *)0x20)) {
      std::operator<<(param_3," ...");
      goto LAB_0015b8db;
    }
    std::operator<<(param_3,' ');
    value = __gnu_cxx::
            __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator*(&local_38);
    UniversalPrint<double>(value,param_3);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_38);
    it._M_current = it._M_current + 1;
  } while( true );
}

Assistant:

void DefaultPrintTo(IsContainer /* dummy */,
                    false_type /* is not a pointer */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}